

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_257,_true,_embree::avx2::VirtualCurveIntersectorK<4>,_true>::
     occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  byte bVar1;
  BVH *bvh;
  NodeRef root;
  ulong uVar2;
  void *pvVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  long lVar7;
  size_t k;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 uVar15;
  undefined8 uVar16;
  vbool<4> vVar17;
  char cVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  size_t mask;
  ulong uVar22;
  undefined4 uVar23;
  ulong uVar24;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar25;
  ulong uVar26;
  NodeRef *pNVar27;
  bool bVar28;
  vint4 ai_1;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 in_ZMM0 [64];
  vint4 ai_3;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  vint4 ai;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  vint4 bi;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  vint4 bi_1;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  vint4 bi_3;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar68;
  float fVar72;
  float fVar73;
  vint4 ai_2;
  float fVar74;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  vint4 bi_2;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  vfloat4 a0;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar97 [64];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar98;
  undefined1 auVar99 [16];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  vbool<4> terminated;
  vbool<4> valid_o;
  TravRayK<4,_true> tray;
  Precalculations pre;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  undefined1 auVar88 [64];
  undefined1 auVar92 [64];
  undefined1 auVar96 [64];
  
  uVar16 = mm_lookupmask_ps._8_8_;
  uVar15 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar50 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar59 = vpcmpeqd_avx(auVar50,(undefined1  [16])valid_i->field_0);
    auVar50 = *(undefined1 (*) [16])(ray + 0x80);
    auVar38 = ZEXT816(0) << 0x40;
    auVar41 = vcmpps_avx(auVar50,auVar38,5);
    auVar41 = vandps_avx(auVar41,auVar59);
    auVar101 = ZEXT1664(auVar41);
    uVar19 = vmovmskps_avx(auVar41);
    if (uVar19 != 0) {
      uVar22 = (ulong)(uVar19 & 0xff);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar59._0_4_ = tray.dir.field_0._32_4_ * tray.dir.field_0._32_4_;
      auVar59._4_4_ = tray.dir.field_0._36_4_ * tray.dir.field_0._36_4_;
      auVar59._8_4_ = tray.dir.field_0._40_4_ * tray.dir.field_0._40_4_;
      auVar59._12_4_ = tray.dir.field_0._44_4_ * tray.dir.field_0._44_4_;
      auVar59 = vfmadd231ps_fma(auVar59,(undefined1  [16])tray.dir.field_0.field_0.y.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar61 = vfmadd231ps_fma(auVar59,(undefined1  [16])tray.dir.field_0.field_0.x.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar59 = vrsqrtps_avx(auVar61);
      fVar68 = auVar59._0_4_;
      fVar72 = auVar59._4_4_;
      fVar73 = auVar59._8_4_;
      fVar74 = auVar59._12_4_;
      auVar60._0_4_ = fVar68 * fVar68 * fVar68 * auVar61._0_4_ * -0.5;
      auVar60._4_4_ = fVar72 * fVar72 * fVar72 * auVar61._4_4_ * -0.5;
      auVar60._8_4_ = fVar73 * fVar73 * fVar73 * auVar61._8_4_ * -0.5;
      auVar60._12_4_ = fVar74 * fVar74 * fVar74 * auVar61._12_4_ * -0.5;
      auVar75._8_4_ = 0x3fc00000;
      auVar75._0_8_ = 0x3fc000003fc00000;
      auVar75._12_4_ = 0x3fc00000;
      pre.depth_scale.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vfmadd213ps_fma(auVar75,auVar59,auVar60);
      auVar61._8_4_ = 0x80000000;
      auVar61._0_8_ = 0x8000000080000000;
      auVar61._12_4_ = 0x80000000;
      do {
        lVar7 = 0;
        for (uVar26 = uVar22; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
          lVar7 = lVar7 + 1;
        }
        uVar26 = (ulong)(uint)((int)lVar7 * 4);
        auVar59 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar26 + 0x40)),
                                ZEXT416(*(uint *)(ray + uVar26 + 0x50)),0x1c);
        auVar59 = vinsertps_avx(auVar59,ZEXT416(*(uint *)(ray + uVar26 + 0x60)),0x28);
        fVar68 = *(float *)((long)pre.ray_space + (uVar26 - 0x10));
        auVar83._0_4_ = auVar59._0_4_ * fVar68;
        auVar83._4_4_ = auVar59._4_4_ * fVar68;
        auVar83._8_4_ = auVar59._8_4_ * fVar68;
        auVar83._12_4_ = auVar59._12_4_ * fVar68;
        auVar60 = vshufpd_avx(auVar83,auVar83,1);
        auVar59 = vmovshdup_avx(auVar83);
        auVar89._0_4_ = auVar59._0_4_ ^ 0x80000000;
        auVar59 = vunpckhps_avx(auVar83,auVar38);
        auVar89._4_12_ = ZEXT812(0) << 0x20;
        auVar85._0_8_ = auVar60._0_8_ ^ 0x8000000080000000;
        auVar85._8_8_ = auVar60._8_8_ ^ auVar61._8_8_;
        auVar75 = vinsertps_avx(auVar85,auVar83,0x2a);
        auVar80 = vshufps_avx(auVar59,auVar89,0x41);
        auVar59 = vdpps_avx(auVar75,auVar75,0x7f);
        auVar60 = vdpps_avx(auVar80,auVar80,0x7f);
        auVar59 = vcmpps_avx(auVar59,auVar60,1);
        auVar93._0_4_ = auVar59._0_4_;
        auVar93._4_4_ = auVar93._0_4_;
        auVar93._8_4_ = auVar93._0_4_;
        auVar93._12_4_ = auVar93._0_4_;
        auVar59 = vblendvps_avx(auVar75,auVar80,auVar93);
        auVar60 = vdpps_avx(auVar59,auVar59,0x7f);
        auVar75 = vrsqrtss_avx(auVar60,auVar60);
        fVar72 = auVar75._0_4_;
        fVar72 = fVar72 * 1.5 - auVar60._0_4_ * 0.5 * fVar72 * fVar72 * fVar72;
        auVar86._0_4_ = auVar59._0_4_ * fVar72;
        auVar86._4_4_ = auVar59._4_4_ * fVar72;
        auVar86._8_4_ = auVar59._8_4_ * fVar72;
        auVar86._12_4_ = auVar59._12_4_ * fVar72;
        auVar59 = vshufps_avx(auVar86,auVar86,0xc9);
        auVar60 = vshufps_avx(auVar83,auVar83,0xc9);
        auVar94._0_4_ = auVar86._0_4_ * auVar60._0_4_;
        auVar94._4_4_ = auVar86._4_4_ * auVar60._4_4_;
        auVar94._8_4_ = auVar86._8_4_ * auVar60._8_4_;
        auVar94._12_4_ = auVar86._12_4_ * auVar60._12_4_;
        auVar59 = vfmsub231ps_fma(auVar94,auVar83,auVar59);
        auVar75 = vshufps_avx(auVar59,auVar59,0xc9);
        auVar59 = vdpps_avx(auVar75,auVar75,0x7f);
        auVar60 = vrsqrtss_avx(auVar59,auVar59);
        fVar72 = auVar60._0_4_;
        fVar72 = fVar72 * 1.5 - auVar59._0_4_ * 0.5 * fVar72 * fVar72 * fVar72;
        uVar22 = uVar22 - 1 & uVar22;
        auVar90._0_4_ = fVar72 * auVar75._0_4_;
        auVar90._4_4_ = fVar72 * auVar75._4_4_;
        auVar90._8_4_ = fVar72 * auVar75._8_4_;
        auVar90._12_4_ = fVar72 * auVar75._12_4_;
        auVar80._0_4_ = fVar68 * auVar83._0_4_;
        auVar80._4_4_ = fVar68 * auVar83._4_4_;
        auVar80._8_4_ = fVar68 * auVar83._8_4_;
        auVar80._12_4_ = fVar68 * auVar83._12_4_;
        auVar75 = vunpcklps_avx(auVar86,auVar80);
        auVar59 = vunpckhps_avx(auVar86,auVar80);
        auVar80 = vunpcklps_avx(auVar90,auVar38);
        auVar60 = vunpckhps_avx(auVar90,auVar38);
        aVar5 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar59,auVar60);
        aVar6 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar75,auVar80);
        aVar4 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar75,auVar80);
        pre.ray_space[lVar7].vx.field_0 = aVar6;
        pre.ray_space[lVar7].vy.field_0 = aVar4;
        pre.ray_space[lVar7].vz.field_0 = aVar5;
      } while (uVar22 != 0);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      auVar87._8_4_ = 0x7fffffff;
      auVar87._0_8_ = 0x7fffffff7fffffff;
      auVar87._12_4_ = 0x7fffffff;
      auVar88 = ZEXT1664(auVar87);
      auVar59 = vandps_avx(auVar87,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar91._8_4_ = 0x219392ef;
      auVar91._0_8_ = 0x219392ef219392ef;
      auVar91._12_4_ = 0x219392ef;
      auVar92 = ZEXT1664(auVar91);
      auVar38 = vcmpps_avx(auVar59,auVar91,1);
      auVar95._8_4_ = 0x3f800000;
      auVar95._0_8_ = &DAT_3f8000003f800000;
      auVar95._12_4_ = 0x3f800000;
      auVar96 = ZEXT1664(auVar95);
      auVar60 = vdivps_avx(auVar95,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar59 = vandps_avx(auVar87,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar61 = vcmpps_avx(auVar59,auVar91,1);
      auVar75 = vdivps_avx(auVar95,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar59 = vandps_avx(auVar87,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar59 = vcmpps_avx(auVar59,auVar91,1);
      auVar76._8_4_ = 0x5d5e0b6b;
      auVar76._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar76._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar60,auVar76,auVar38);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar75,auVar76,auVar61);
      auVar38 = vdivps_avx(auVar95,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar38,auVar76,auVar59);
      auVar38 = ZEXT816(0) << 0x20;
      auVar59 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar38,1);
      auVar62._8_4_ = 0x20;
      auVar62._0_8_ = 0x2000000020;
      auVar62._12_4_ = 0x20;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar59,auVar62);
      auVar59 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar38,5);
      auVar63._8_4_ = 0x40;
      auVar63._0_8_ = 0x4000000040;
      auVar63._12_4_ = 0x40;
      auVar69._8_4_ = 0x60;
      auVar69._0_8_ = 0x6000000060;
      auVar69._12_4_ = 0x60;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar69,auVar63,auVar59);
      auVar59 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar38,5);
      auVar46._8_4_ = 0x80;
      auVar46._0_8_ = 0x8000000080;
      auVar46._12_4_ = 0x80;
      auVar51._8_4_ = 0xa0;
      auVar51._0_8_ = 0xa0000000a0;
      auVar51._12_4_ = 0xa0;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar51,auVar46,auVar59);
      auVar59 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar38);
      auVar50 = vmaxps_avx(auVar50,auVar38);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar97 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar59,auVar41);
      auVar38._8_4_ = 0xff800000;
      auVar38._0_8_ = 0xff800000ff800000;
      auVar38._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar38,auVar50,auVar41);
      auVar50 = vpcmpeqd_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])tray.tfar.field_0
                            );
      terminated.field_0._0_4_ = auVar41._0_4_ ^ auVar50._0_4_;
      terminated.field_0._4_4_ = auVar41._4_4_ ^ auVar50._4_4_;
      terminated.field_0._8_4_ = auVar41._8_4_ ^ auVar50._8_4_;
      terminated.field_0._12_4_ = auVar41._12_4_ ^ auVar50._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar19 = 3;
      }
      else {
        uVar19 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar27 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar25 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      do {
        paVar25 = &((vfloat<4> *)paVar25)[-1].field_0;
        root.ptr = pNVar27[-1].ptr;
        pNVar27 = pNVar27 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_00635a0d:
          iVar21 = 3;
        }
        else {
          aVar98 = *paVar25;
          auVar50 = vcmpps_avx((undefined1  [16])aVar98,(undefined1  [16])tray.tfar.field_0,1);
          uVar20 = vmovmskps_avx(auVar50);
          if (uVar20 == 0) {
            iVar21 = 2;
          }
          else {
            uVar22 = (ulong)(uVar20 & 0xff);
            uVar20 = POPCOUNT(uVar20 & 0xff);
            iVar21 = 0;
            if (uVar20 <= uVar19) {
              do {
                k = 0;
                for (uVar26 = uVar22; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000)
                {
                  k = k + 1;
                }
                bVar28 = occluded1(This,bvh,root,k,&pre,ray,&tray,context);
                if (bVar28) {
                  terminated.field_0.i[k] = -1;
                }
                uVar22 = uVar22 - 1 & uVar22;
              } while (uVar22 != 0);
              auVar50 = _DAT_01febe20 & ~(undefined1  [16])terminated.field_0;
              iVar21 = 3;
              auVar101 = ZEXT1664(auVar101._0_16_);
              auVar88 = ZEXT1664(auVar88._0_16_);
              auVar92 = ZEXT1664(CONCAT412(0x219392ef,CONCAT48(0x219392ef,0x219392ef219392ef)));
              auVar96 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,&DAT_3f8000003f800000)));
              auVar97 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar50[0xf] < '\0') {
                auVar50._8_4_ = 0xff800000;
                auVar50._0_8_ = 0xff800000ff800000;
                auVar50._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar50,
                                   (undefined1  [16])terminated.field_0);
                iVar21 = 2;
              }
            }
            vVar17.field_0 = terminated.field_0;
            if (uVar19 < uVar20) {
              auVar50 = auVar88._0_16_;
              do {
                if ((root.ptr & 8) != 0) {
                  if (root.ptr != 0xfffffffffffffff8) {
                    auVar41 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                         (undefined1  [16])aVar98,6);
                    if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar41 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar41 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar41[0xf]) {
                      iVar21 = 2;
                    }
                    else {
                      bVar1 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                      pvVar3 = This->leafIntersector;
                      valid_o.field_0._0_8_ = uVar15;
                      valid_o.field_0._8_8_ = uVar16;
                      uVar20 = vmovmskps_avx((undefined1  [16])terminated.field_0);
                      if ((uVar20 ^ 0xf) != 0) {
                        uVar22 = (ulong)(byte)(uVar20 ^ 0xf);
                        do {
                          lVar7 = 0;
                          for (uVar26 = uVar22; (uVar26 & 1) == 0;
                              uVar26 = uVar26 >> 1 | 0x8000000000000000) {
                            lVar7 = lVar7 + 1;
                          }
                          cVar18 = (**(code **)((long)pvVar3 + (ulong)bVar1 * 0x40 + 0x18))
                                             (&pre,ray,lVar7,context,
                                              (byte *)(root.ptr & 0xfffffffffffffff0));
                          if (cVar18 != '\0') {
                            valid_o.field_0.i[lVar7] = -1;
                          }
                          uVar22 = uVar22 - 1 & uVar22;
                        } while (uVar22 != 0);
                      }
                      auVar8._8_8_ = valid_o.field_0._8_8_;
                      auVar8._0_8_ = valid_o.field_0._0_8_;
                      terminated.field_0 =
                           (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                           vorps_avx((undefined1  [16])vVar17.field_0,auVar8);
                      auVar41 = _DAT_01febe20 & ~(undefined1  [16])terminated.field_0;
                      if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar41 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar41 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar41[0xf]) {
                        iVar21 = 3;
                      }
                      else {
                        auVar99._8_4_ = 0xff800000;
                        auVar99._0_8_ = 0xff800000ff800000;
                        auVar99._12_4_ = 0xff800000;
                        tray.tfar.field_0 =
                             (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                             vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar99,
                                           (undefined1  [16])terminated.field_0);
                        iVar21 = 0;
                      }
                    }
                    auVar101 = ZEXT1664(auVar101._0_16_);
                    auVar88 = ZEXT1664(auVar50);
                    auVar92 = ZEXT1664(CONCAT412(0x219392ef,CONCAT48(0x219392ef,0x219392ef219392ef))
                                      );
                    auVar96 = ZEXT1664(CONCAT412(0x3f800000,
                                                 CONCAT48(0x3f800000,&DAT_3f8000003f800000)));
                    auVar97 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000))
                                      );
                    break;
                  }
                  goto LAB_00635a0d;
                }
                uVar24 = root.ptr & 0xfffffffffffffff0;
                auVar100 = ZEXT1664(auVar97._0_16_);
                uVar22 = 0;
                uVar26 = 8;
                do {
                  uVar2 = *(ulong *)(uVar24 + uVar22 * 8);
                  if (uVar2 != 8) {
                    if ((root.ptr & 7) == 0) {
                      uVar23 = *(undefined4 *)(root.ptr + 0x40 + uVar22 * 4);
                      auVar29._4_4_ = uVar23;
                      auVar29._0_4_ = uVar23;
                      auVar29._8_4_ = uVar23;
                      auVar29._12_4_ = uVar23;
                      auVar9._8_8_ = tray.org.field_0._8_8_;
                      auVar9._0_8_ = tray.org.field_0._0_8_;
                      auVar11._8_8_ = tray.org.field_0._24_8_;
                      auVar11._0_8_ = tray.org.field_0._16_8_;
                      auVar13._8_8_ = tray.org.field_0._40_8_;
                      auVar13._0_8_ = tray.org.field_0._32_8_;
                      auVar41 = vsubps_avx(auVar29,auVar9);
                      auVar64._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar41._0_4_;
                      auVar64._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar41._4_4_;
                      auVar64._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar41._8_4_;
                      auVar64._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar41._12_4_;
                      uVar23 = *(undefined4 *)(root.ptr + 0x80 + uVar22 * 4);
                      auVar30._4_4_ = uVar23;
                      auVar30._0_4_ = uVar23;
                      auVar30._8_4_ = uVar23;
                      auVar30._12_4_ = uVar23;
                      auVar41 = vsubps_avx(auVar30,auVar11);
                      auVar77._0_4_ = tray.rdir.field_0._16_4_ * auVar41._0_4_;
                      auVar77._4_4_ = tray.rdir.field_0._20_4_ * auVar41._4_4_;
                      auVar77._8_4_ = tray.rdir.field_0._24_4_ * auVar41._8_4_;
                      auVar77._12_4_ = tray.rdir.field_0._28_4_ * auVar41._12_4_;
                      uVar23 = *(undefined4 *)(root.ptr + 0xc0 + uVar22 * 4);
                      auVar31._4_4_ = uVar23;
                      auVar31._0_4_ = uVar23;
                      auVar31._8_4_ = uVar23;
                      auVar31._12_4_ = uVar23;
                      auVar41 = vsubps_avx(auVar31,auVar13);
                      auVar84._0_4_ = tray.rdir.field_0._32_4_ * auVar41._0_4_;
                      auVar84._4_4_ = tray.rdir.field_0._36_4_ * auVar41._4_4_;
                      auVar84._8_4_ = tray.rdir.field_0._40_4_ * auVar41._8_4_;
                      auVar84._12_4_ = tray.rdir.field_0._44_4_ * auVar41._12_4_;
                      uVar23 = *(undefined4 *)(root.ptr + 0x60 + uVar22 * 4);
                      auVar32._4_4_ = uVar23;
                      auVar32._0_4_ = uVar23;
                      auVar32._8_4_ = uVar23;
                      auVar32._12_4_ = uVar23;
                      auVar41 = vsubps_avx(auVar32,auVar9);
                      auVar39._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar41._0_4_;
                      auVar39._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar41._4_4_;
                      auVar39._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar41._8_4_;
                      auVar39._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar41._12_4_;
                      uVar23 = *(undefined4 *)(root.ptr + 0xa0 + uVar22 * 4);
                      auVar33._4_4_ = uVar23;
                      auVar33._0_4_ = uVar23;
                      auVar33._8_4_ = uVar23;
                      auVar33._12_4_ = uVar23;
                      auVar41 = vsubps_avx(auVar33,auVar11);
                      auVar47._0_4_ = tray.rdir.field_0._16_4_ * auVar41._0_4_;
                      auVar47._4_4_ = tray.rdir.field_0._20_4_ * auVar41._4_4_;
                      auVar47._8_4_ = tray.rdir.field_0._24_4_ * auVar41._8_4_;
                      auVar47._12_4_ = tray.rdir.field_0._28_4_ * auVar41._12_4_;
                      uVar23 = *(undefined4 *)(root.ptr + 0xe0 + uVar22 * 4);
                      auVar34._4_4_ = uVar23;
                      auVar34._0_4_ = uVar23;
                      auVar34._8_4_ = uVar23;
                      auVar34._12_4_ = uVar23;
                      auVar41 = vsubps_avx(auVar34,auVar13);
                      auVar52._0_4_ = tray.rdir.field_0._32_4_ * auVar41._0_4_;
                      auVar52._4_4_ = tray.rdir.field_0._36_4_ * auVar41._4_4_;
                      auVar52._8_4_ = tray.rdir.field_0._40_4_ * auVar41._8_4_;
                      auVar52._12_4_ = tray.rdir.field_0._44_4_ * auVar41._12_4_;
                      auVar41 = vminps_avx(auVar64,auVar39);
                      auVar59 = vminps_avx(auVar77,auVar47);
                      auVar41 = vmaxps_avx(auVar41,auVar59);
                      auVar59 = vminps_avx(auVar84,auVar52);
                      auVar41 = vmaxps_avx(auVar41,auVar59);
                      auVar35._0_4_ = auVar41._0_4_ * 0.99999964;
                      auVar35._4_4_ = auVar41._4_4_ * 0.99999964;
                      auVar35._8_4_ = auVar41._8_4_ * 0.99999964;
                      auVar35._12_4_ = auVar41._12_4_ * 0.99999964;
                      auVar41 = vmaxps_avx(auVar64,auVar39);
                      auVar59 = vmaxps_avx(auVar77,auVar47);
                      auVar59 = vminps_avx(auVar41,auVar59);
                      auVar41 = vmaxps_avx(auVar84,auVar52);
                      auVar59 = vminps_avx(auVar59,auVar41);
                      auVar41 = vmaxps_avx(auVar35,(undefined1  [16])tray.tnear.field_0);
                      auVar40._0_4_ = auVar59._0_4_ * 1.0000004;
                      auVar40._4_4_ = auVar59._4_4_ * 1.0000004;
                      auVar40._8_4_ = auVar59._8_4_ * 1.0000004;
                      auVar40._12_4_ = auVar59._12_4_ * 1.0000004;
                      auVar59 = vminps_avx(auVar40,(undefined1  [16])tray.tfar.field_0);
                    }
                    else {
                      uVar23 = *(undefined4 *)(uVar24 + 0xa0 + uVar22 * 4);
                      auVar65._4_4_ = uVar23;
                      auVar65._0_4_ = uVar23;
                      auVar65._8_4_ = uVar23;
                      auVar65._12_4_ = uVar23;
                      uVar23 = *(undefined4 *)(uVar24 + 0xc0 + uVar22 * 4);
                      auVar56._4_4_ = uVar23;
                      auVar56._0_4_ = uVar23;
                      auVar56._8_4_ = uVar23;
                      auVar56._12_4_ = uVar23;
                      uVar23 = *(undefined4 *)(uVar24 + 0xe0 + uVar22 * 4);
                      auVar53._4_4_ = uVar23;
                      auVar53._0_4_ = uVar23;
                      auVar53._8_4_ = uVar23;
                      auVar53._12_4_ = uVar23;
                      fVar68 = *(float *)(uVar24 + 0x100 + uVar22 * 4);
                      auVar70._4_4_ = fVar68;
                      auVar70._0_4_ = fVar68;
                      auVar70._8_4_ = fVar68;
                      auVar70._12_4_ = fVar68;
                      fVar72 = *(float *)(uVar24 + 0x120 + uVar22 * 4);
                      auVar78._4_4_ = fVar72;
                      auVar78._0_4_ = fVar72;
                      auVar78._8_4_ = fVar72;
                      auVar78._12_4_ = fVar72;
                      fVar73 = *(float *)(uVar24 + 0x140 + uVar22 * 4);
                      auVar81._4_4_ = fVar73;
                      auVar81._0_4_ = fVar73;
                      auVar81._8_4_ = fVar73;
                      auVar81._12_4_ = fVar73;
                      uVar23 = *(undefined4 *)(uVar24 + 0x160 + uVar22 * 4);
                      auVar41._4_4_ = uVar23;
                      auVar41._0_4_ = uVar23;
                      auVar41._8_4_ = uVar23;
                      auVar41._12_4_ = uVar23;
                      uVar23 = *(undefined4 *)(uVar24 + 0x180 + uVar22 * 4);
                      auVar36._4_4_ = uVar23;
                      auVar36._0_4_ = uVar23;
                      auVar36._8_4_ = uVar23;
                      auVar36._12_4_ = uVar23;
                      uVar23 = *(undefined4 *)(uVar24 + 0x1a0 + uVar22 * 4);
                      auVar42._4_4_ = uVar23;
                      auVar42._0_4_ = uVar23;
                      auVar42._8_4_ = uVar23;
                      auVar42._12_4_ = uVar23;
                      auVar14._8_8_ = tray.org.field_0._40_8_;
                      auVar14._0_8_ = tray.org.field_0._32_8_;
                      auVar41 = vfmadd231ps_fma(auVar41,auVar14,auVar70);
                      auVar59 = vfmadd231ps_fma(auVar36,auVar14,auVar78);
                      auVar38 = vfmadd231ps_fma(auVar42,auVar14,auVar81);
                      auVar71._0_4_ = (float)tray.dir.field_0._32_4_ * fVar68;
                      auVar71._4_4_ = (float)tray.dir.field_0._36_4_ * fVar68;
                      auVar71._8_4_ = (float)tray.dir.field_0._40_4_ * fVar68;
                      auVar71._12_4_ = (float)tray.dir.field_0._44_4_ * fVar68;
                      auVar79._0_4_ = (float)tray.dir.field_0._32_4_ * fVar72;
                      auVar79._4_4_ = (float)tray.dir.field_0._36_4_ * fVar72;
                      auVar79._8_4_ = (float)tray.dir.field_0._40_4_ * fVar72;
                      auVar79._12_4_ = (float)tray.dir.field_0._44_4_ * fVar72;
                      auVar82._0_4_ = fVar73 * (float)tray.dir.field_0._32_4_;
                      auVar82._4_4_ = fVar73 * (float)tray.dir.field_0._36_4_;
                      auVar82._8_4_ = fVar73 * (float)tray.dir.field_0._40_4_;
                      auVar82._12_4_ = fVar73 * (float)tray.dir.field_0._44_4_;
                      auVar61 = vfmadd231ps_fma(auVar71,(undefined1  [16])
                                                        tray.dir.field_0.field_0.y.field_0,auVar65);
                      auVar60 = vfmadd231ps_fma(auVar79,(undefined1  [16])
                                                        tray.dir.field_0.field_0.y.field_0,auVar56);
                      auVar75 = vfmadd231ps_fma(auVar82,auVar53,
                                                (undefined1  [16])tray.dir.field_0.field_0.y.field_0
                                               );
                      auVar12._8_8_ = tray.org.field_0._24_8_;
                      auVar12._0_8_ = tray.org.field_0._16_8_;
                      auVar80 = vfmadd231ps_fma(auVar41,auVar12,auVar65);
                      uVar23 = *(undefined4 *)(uVar24 + 0x40 + uVar22 * 4);
                      auVar66._4_4_ = uVar23;
                      auVar66._0_4_ = uVar23;
                      auVar66._8_4_ = uVar23;
                      auVar66._12_4_ = uVar23;
                      auVar83 = vfmadd231ps_fma(auVar59,auVar12,auVar56);
                      uVar23 = *(undefined4 *)(uVar24 + 0x60 + uVar22 * 4);
                      auVar57._4_4_ = uVar23;
                      auVar57._0_4_ = uVar23;
                      auVar57._8_4_ = uVar23;
                      auVar57._12_4_ = uVar23;
                      auVar85 = vfmadd231ps_fma(auVar38,auVar12,auVar53);
                      uVar23 = *(undefined4 *)(uVar24 + 0x80 + uVar22 * 4);
                      auVar54._4_4_ = uVar23;
                      auVar54._0_4_ = uVar23;
                      auVar54._8_4_ = uVar23;
                      auVar54._12_4_ = uVar23;
                      auVar59 = vfmadd231ps_fma(auVar61,(undefined1  [16])
                                                        tray.dir.field_0.field_0.x.field_0,auVar66);
                      auVar38 = vfmadd231ps_fma(auVar60,(undefined1  [16])
                                                        tray.dir.field_0.field_0.x.field_0,auVar57);
                      auVar61 = vfmadd231ps_fma(auVar75,auVar54,
                                                (undefined1  [16])tray.dir.field_0.field_0.x.field_0
                                               );
                      auVar41 = vandps_avx(auVar50,auVar59);
                      auVar60 = auVar92._0_16_;
                      auVar41 = vcmpps_avx(auVar41,auVar60,1);
                      auVar59 = vblendvps_avx(auVar59,auVar60,auVar41);
                      auVar41 = vandps_avx(auVar50,auVar38);
                      auVar41 = vcmpps_avx(auVar41,auVar60,1);
                      auVar38 = vblendvps_avx(auVar38,auVar60,auVar41);
                      auVar41 = vandps_avx(auVar61,auVar50);
                      auVar41 = vcmpps_avx(auVar41,auVar60,1);
                      auVar41 = vblendvps_avx(auVar61,auVar60,auVar41);
                      auVar61 = vrcpps_avx(auVar59);
                      auVar60 = auVar96._0_16_;
                      auVar59 = vfnmadd213ps_fma(auVar59,auVar61,auVar60);
                      auVar61 = vfmadd132ps_fma(auVar59,auVar61,auVar61);
                      auVar59 = vrcpps_avx(auVar38);
                      auVar38 = vfnmadd213ps_fma(auVar38,auVar59,auVar60);
                      auVar38 = vfmadd132ps_fma(auVar38,auVar59,auVar59);
                      auVar59 = vrcpps_avx(auVar41);
                      auVar41 = vfnmadd213ps_fma(auVar41,auVar59,auVar60);
                      auVar41 = vfmadd132ps_fma(auVar41,auVar59,auVar59);
                      auVar10._8_8_ = tray.org.field_0._8_8_;
                      auVar10._0_8_ = tray.org.field_0._0_8_;
                      auVar59 = vfmadd231ps_fma(auVar80,auVar10,auVar66);
                      auVar60 = vfmadd231ps_fma(auVar83,auVar10,auVar57);
                      auVar75 = vfmadd231ps_fma(auVar85,auVar10,auVar54);
                      auVar49._0_4_ = auVar59._0_4_ * -auVar61._0_4_;
                      auVar49._4_4_ = auVar59._4_4_ * -auVar61._4_4_;
                      auVar49._8_4_ = auVar59._8_4_ * -auVar61._8_4_;
                      auVar49._12_4_ = auVar59._12_4_ * -auVar61._12_4_;
                      auVar37._0_4_ = auVar60._0_4_ * -auVar38._0_4_;
                      auVar37._4_4_ = auVar60._4_4_ * -auVar38._4_4_;
                      auVar37._8_4_ = auVar60._8_4_ * -auVar38._8_4_;
                      auVar37._12_4_ = auVar60._12_4_ * -auVar38._12_4_;
                      auVar43._0_4_ = auVar75._0_4_ * -auVar41._0_4_;
                      auVar43._4_4_ = auVar75._4_4_ * -auVar41._4_4_;
                      auVar43._8_4_ = auVar75._8_4_ * -auVar41._8_4_;
                      auVar43._12_4_ = auVar75._12_4_ * -auVar41._12_4_;
                      auVar55._0_4_ = auVar61._0_4_ + auVar49._0_4_;
                      auVar55._4_4_ = auVar61._4_4_ + auVar49._4_4_;
                      auVar55._8_4_ = auVar61._8_4_ + auVar49._8_4_;
                      auVar55._12_4_ = auVar61._12_4_ + auVar49._12_4_;
                      auVar58._0_4_ = auVar38._0_4_ + auVar37._0_4_;
                      auVar58._4_4_ = auVar38._4_4_ + auVar37._4_4_;
                      auVar58._8_4_ = auVar38._8_4_ + auVar37._8_4_;
                      auVar58._12_4_ = auVar38._12_4_ + auVar37._12_4_;
                      auVar67._0_4_ = auVar41._0_4_ + auVar43._0_4_;
                      auVar67._4_4_ = auVar41._4_4_ + auVar43._4_4_;
                      auVar67._8_4_ = auVar41._8_4_ + auVar43._8_4_;
                      auVar67._12_4_ = auVar41._12_4_ + auVar43._12_4_;
                      auVar41 = vpminsd_avx(auVar49,auVar55);
                      auVar59 = vpminsd_avx(auVar37,auVar58);
                      auVar41 = vpmaxsd_avx(auVar41,auVar59);
                      auVar59 = vpminsd_avx(auVar43,auVar67);
                      auVar41 = vpmaxsd_avx(auVar41,auVar59);
                      auVar59 = vpmaxsd_avx(auVar49,auVar55);
                      auVar38 = vpmaxsd_avx(auVar37,auVar58);
                      auVar38 = vpminsd_avx(auVar59,auVar38);
                      auVar59 = vpmaxsd_avx(auVar43,auVar67);
                      auVar59 = vpminsd_avx(auVar38,auVar59);
                      auVar35._0_4_ = auVar41._0_4_ * 0.99999964;
                      auVar35._4_4_ = auVar41._4_4_ * 0.99999964;
                      auVar35._8_4_ = auVar41._8_4_ * 0.99999964;
                      auVar35._12_4_ = auVar41._12_4_ * 0.99999964;
                      auVar41 = vpmaxsd_avx(auVar35,(undefined1  [16])tray.tnear.field_0);
                      auVar44._0_4_ = auVar59._0_4_ * 1.0000004;
                      auVar44._4_4_ = auVar59._4_4_ * 1.0000004;
                      auVar44._8_4_ = auVar59._8_4_ * 1.0000004;
                      auVar44._12_4_ = auVar59._12_4_ * 1.0000004;
                      auVar59 = vpminsd_avx(auVar44,(undefined1  [16])tray.tfar.field_0);
                    }
                    auVar41 = vcmpps_avx(auVar41,auVar59,2);
                    auVar48._8_8_ = 0x100000001;
                    auVar48._0_8_ = 0x100000001;
                    if ((auVar48 & auVar41) != (undefined1  [16])0x0) {
                      auVar41 = vpslld_avx(auVar41,0x1f);
                      auVar41 = vblendvps_avx(auVar97._0_16_,auVar35,auVar41);
                      if (uVar26 != 8) {
                        pNVar27->ptr = uVar26;
                        pNVar27 = pNVar27 + 1;
                        *paVar25 = auVar100._0_16_;
                        paVar25 = paVar25 + 1;
                      }
                      auVar100 = ZEXT1664(auVar41);
                      uVar26 = uVar2;
                    }
                  }
                  aVar98 = auVar100._0_16_;
                } while ((uVar2 != 8) && (bVar28 = uVar22 < 7, uVar22 = uVar22 + 1, bVar28));
                iVar21 = 0;
                if (uVar26 == 8) {
LAB_006358c2:
                  bVar28 = false;
                  iVar21 = 4;
                }
                else {
                  auVar41 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar98,
                                       6);
                  uVar23 = vmovmskps_avx(auVar41);
                  bVar28 = true;
                  if ((uint)POPCOUNT(uVar23) <= uVar19) {
                    pNVar27->ptr = uVar26;
                    pNVar27 = pNVar27 + 1;
                    *paVar25 = aVar98;
                    paVar25 = paVar25 + 1;
                    goto LAB_006358c2;
                  }
                }
                root.ptr = uVar26;
              } while (bVar28);
            }
          }
        }
      } while (iVar21 != 3);
      auVar50 = vandps_avx(auVar101._0_16_,(undefined1  [16])terminated.field_0);
      auVar45._8_4_ = 0xff800000;
      auVar45._0_8_ = 0xff800000ff800000;
      auVar45._12_4_ = 0xff800000;
      auVar50 = vmaskmovps_avx(auVar50,auVar45);
      *(undefined1 (*) [16])(ray + 0x80) = auVar50;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }